

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageReceiver.cpp
# Opt level: O0

int __thiscall unixsocketipc::MessageReceiver::listen(MessageReceiver *this,int __fd,int __n)

{
  bool bVar1;
  uint uVar2;
  bool local_8d;
  int client_socket_fd;
  undefined1 local_86;
  bool keep_working;
  uint remote_length;
  sockaddr_un remote;
  MessageReceiver *this_local;
  MessageReceiver *pMVar3;
  
  if (this->server_socket_fd == 0) {
    this_local._7_1_ = 0;
    pMVar3 = this;
  }
  else {
    remote.sun_path._100_8_ = this;
    uVar2 = ::listen(this->server_socket_fd,1);
    client_socket_fd = 0x6e;
    local_8d = true;
    while (pMVar3 = (MessageReceiver *)(ulong)uVar2, local_8d != false) {
      uVar2 = accept(this->server_socket_fd,(sockaddr *)&local_86,(socklen_t *)&client_socket_fd);
      pMVar3 = (MessageReceiver *)(ulong)uVar2;
      if (uVar2 == 0xffffffff) {
        this_local._7_1_ = 0;
        goto LAB_00103cca;
      }
      bVar1 = std::function::operator_cast_to_bool((function *)&this->on_client_connected);
      if (bVar1) {
        std::function<void_()>::operator()(&this->on_client_connected);
      }
      local_8d = handle_next_client(this,uVar2);
      uVar2 = close(uVar2);
    }
    this_local._7_1_ = 1;
  }
LAB_00103cca:
  return (int)CONCAT71((int7)((ulong)pMVar3 >> 8),this_local._7_1_);
}

Assistant:

bool MessageReceiver::listen() {
   if (!server_socket_fd) {
      DEBUG_MSG("%s: not initialized\n", __FUNCTION__);
      return false;
   }

   // mark socket as listening socket
   ::listen(server_socket_fd, 1); // 1 is max size of waiting connections queue, more connection will be rejected

   sockaddr_un remote;
   unsigned remote_length = sizeof(remote);

   // listen for incoming connections
   bool keep_working = true;
   while (keep_working) {
       DEBUG_MSG("%s: listening for incoming connection...\n", __FUNCTION__);

       // 1. accept new client socket
       int client_socket_fd = accept(server_socket_fd, (sockaddr*)&remote, &remote_length); // remote is filled with remote config
       if (client_socket_fd == -1) {
          DEBUG_MSG("%s: accept failed\n", __FUNCTION__);
          return false;
       }

       // 2. notify about new client connected
       if (on_client_connected)
           on_client_connected();

       // 3. handle the client
       keep_working = handle_next_client(client_socket_fd);

       // 4. communication done. Close the client socket
      ::close(client_socket_fd);
   }

   DEBUG_MSG("%s: listening done\n", __FUNCTION__);
   return true;
}